

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O3

int Rtm_ManMarkAutoFwd(Rtm_Man_t *pRtm)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  long lVar4;
  
  if (pRtm->vObjs->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  Rtm_ObjMarkAutoFwd_rec((Rtm_Obj_t *)*pRtm->vObjs->pArray);
  pVVar2 = pRtm->vPis;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      Rtm_ObjMarkAutoFwd_rec((Rtm_Obj_t *)pVVar2->pArray[lVar4]);
      lVar4 = lVar4 + 1;
      pVVar2 = pRtm->vPis;
    } while (lVar4 < pVVar2->nSize);
  }
  pVVar2 = pRtm->vObjs;
  if (pVVar2->nSize < 1) {
    iVar1 = 0;
  }
  else {
    lVar4 = 0;
    iVar1 = 0;
    do {
      uVar3 = *(uint *)((long)pVVar2->pArray[lVar4] + 8) ^ 0x10;
      *(uint *)((long)pVVar2->pArray[lVar4] + 8) = uVar3;
      iVar1 = iVar1 + (uint)((uVar3 >> 4 & 1) != 0);
      lVar4 = lVar4 + 1;
      pVVar2 = pRtm->vObjs;
    } while (lVar4 < pVVar2->nSize);
  }
  return iVar1;
}

Assistant:

int Rtm_ManMarkAutoFwd( Rtm_Man_t * pRtm )
{
    Rtm_Obj_t * pObjRtm;
    int i, Counter = 0;
    // mark nodes reachable from the PIs
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    Rtm_ObjMarkAutoFwd_rec( pObjRtm );
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        Rtm_ObjMarkAutoFwd_rec( pObjRtm );
    // count the number of autonomous nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    {
        pObjRtm->fAuto = !pObjRtm->fAuto;
        Counter += pObjRtm->fAuto;
    }
    // mark the fanins of the autonomous nodes
    return Counter;
}